

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_matrix_matrix_addition_Test::~test_matrix_sparse_matrix_matrix_addition_Test
          (test_matrix_sparse_matrix_matrix_addition_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, matrix_matrix_addition) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  Matrix_Sparse matrix_result;
  matrix_result = identity + matrix;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(identity[0][0], 1.0);
  EXPECT_DOUBLE_EQ(identity[1][1], 1.0);
  EXPECT_DOUBLE_EQ(identity[2][2], 1.0);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -4.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);

  EXPECT_EQ(matrix_result.size_row(), 3);
  EXPECT_EQ(matrix_result.size_column(), 3);
  EXPECT_EQ(matrix_result.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix_result[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_result[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix_result[1][1], -3.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][2], 1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix + matrix_wrong_size, "./*");
}